

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * cJSON_CreateStringArray(char **strings,int count)

{
  cJSON *item;
  cJSON *pcVar1;
  ulong uVar2;
  cJSON *pcVar3;
  
  if (strings != (char **)0x0 && -1 < count) {
    item = cJSON_CreateArray();
    pcVar3 = (cJSON *)0x0;
    for (uVar2 = 0; (item != (cJSON *)0x0 && (uVar2 < (uint)count)); uVar2 = uVar2 + 1) {
      pcVar1 = cJSON_CreateString(strings[uVar2]);
      if (pcVar1 == (cJSON *)0x0) {
        cJSON_Delete(item);
        return (cJSON *)0x0;
      }
      if (uVar2 == 0) {
        item->child = pcVar1;
      }
      else {
        pcVar3->next = pcVar1;
        pcVar1->prev = pcVar3;
      }
      pcVar3 = pcVar1;
    }
    if (item != (cJSON *)0x0) {
      if (item->child != (cJSON *)0x0) {
        item->child->prev = pcVar3;
        return item;
      }
      return item;
    }
  }
  return (cJSON *)0x0;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateStringArray(const char *const *strings, int count)
{
    size_t i = 0;
    cJSON *n = NULL;
    cJSON *p = NULL;
    cJSON *a = NULL;

    if ((count < 0) || (strings == NULL))
    {
        return NULL;
    }

    a = cJSON_CreateArray();

    for (i = 0; a && (i < (size_t)count); i++)
    {
        n = cJSON_CreateString(strings[i]);
        if(!n)
        {
            cJSON_Delete(a);
            return NULL;
        }
        if(!i)
        {
            a->child = n;
        }
        else
        {
            suffix_object(p,n);
        }
        p = n;
    }

    if (a && a->child) {
        a->child->prev = n;
    }

    return a;
}